

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getRowMinAbsUnscaled
          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,
          SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *lp,int i)

{
  int iVar1;
  int iVar2;
  DataArray<int> *pDVar3;
  DataArray<int> *pDVar4;
  bool bVar5;
  fpclass_type fVar6;
  int32_t iVar7;
  bool bVar8;
  double *pdVar9;
  int *piVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *a;
  long lVar15;
  int *piVar16;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *p_Var17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  uint *puVar19;
  soplex *psVar20;
  uint *puVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar22;
  Item *pIVar23;
  byte bVar24;
  Real eps;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_320 [7];
  int local_2b0;
  bool local_2ac;
  fpclass_type local_2a8;
  int32_t local_2a4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_220;
  soplex local_1a0 [112];
  int local_130;
  undefined1 local_12c;
  undefined8 local_128;
  uint local_120 [28];
  soplex local_b0 [128];
  
  bVar24 = 0;
  pDVar3 = this->m_activeColscaleExp;
  pDVar4 = this->m_activeRowscaleExp;
  pIVar23 = (lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem +
            (lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey[i].idx;
  pdVar9 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&__return_storage_ptr__->m_backend,*pdVar9,(type *)0x0);
  iVar1 = pDVar4->data[i];
  lVar11 = 0x80;
  for (lVar15 = 0;
      lVar15 < (pIVar23->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .memused; lVar15 = lVar15 + 1) {
    piVar10 = (int *)((long)&(((pIVar23->data).
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .m_elem)->val).m_backend.data + lVar11);
    iVar2 = pDVar3->data[*piVar10];
    lVar14 = 0x1c;
    piVar16 = piVar10 + -0x20;
    psVar20 = local_1a0;
    for (lVar12 = lVar14; lVar12 != 0; lVar12 = lVar12 + -1) {
      *(int *)psVar20 = *piVar16;
      piVar16 = piVar16 + (ulong)bVar24 * -2 + 1;
      psVar20 = psVar20 + (ulong)bVar24 * -8 + 4;
    }
    local_130 = piVar10[-4];
    local_12c = (undefined1)piVar10[-3];
    local_128 = *(undefined8 *)(piVar10 + -2);
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)local_b0,local_1a0,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(ulong)(uint)-(iVar2 + iVar1),CONCAT31((int3)((uint)local_130 >> 8),local_12c));
    spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)1>>
              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)local_320,local_b0,a);
    iVar7 = local_2a4;
    fVar6 = local_2a8;
    bVar5 = local_2ac;
    iVar2 = local_2b0;
    puVar19 = local_120;
    p_Var17 = local_320;
    puVar21 = puVar19;
    for (lVar12 = lVar14; lVar13 = lVar14, pnVar18 = &local_2a0, lVar12 != 0; lVar12 = lVar12 + -1)
    {
      *puVar21 = *(uint *)&p_Var17->_M_ptr;
      p_Var17 = (__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)
                ((long)p_Var17 + (ulong)bVar24 * -8 + 4);
      puVar21 = puVar21 + (ulong)bVar24 * -2 + 1;
    }
    for (; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pnVar18->m_backend).data._M_elems[0] = *puVar19;
      puVar19 = puVar19 + (ulong)bVar24 * -2 + 1;
      pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar18 + ((ulong)bVar24 * -2 + 1) * 4);
    }
    local_2a0.m_backend.exp = local_2b0;
    local_2a0.m_backend.neg = local_2ac;
    local_2a0.m_backend.fpclass = local_2a8;
    local_2a0.m_backend.prec_elem = local_2a4;
    pnVar18 = __return_storage_ptr__;
    pnVar22 = &local_220;
    for (; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pnVar22->m_backend).data._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
      pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar18 + ((ulong)bVar24 * -2 + 1) * 4);
      pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar22 + ((ulong)bVar24 * -2 + 1) * 4);
    }
    local_220.m_backend.exp = (__return_storage_ptr__->m_backend).exp;
    local_220.m_backend.neg = (__return_storage_ptr__->m_backend).neg;
    local_220.m_backend.fpclass = (__return_storage_ptr__->m_backend).fpclass;
    local_220.m_backend.prec_elem = (__return_storage_ptr__->m_backend).prec_elem;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (local_320,
               &(this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    eps = Tolerances::epsilon(local_320[0]._M_ptr);
    bVar8 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_2a0,&local_220,eps);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_320[0]._M_refcount);
    if (bVar8) {
      puVar19 = local_120;
      pnVar18 = __return_storage_ptr__;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pnVar18->m_backend).data._M_elems[0] = *puVar19;
        puVar19 = puVar19 + (ulong)bVar24 * -2 + 1;
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + ((ulong)bVar24 * -2 + 1) * 4);
      }
      (__return_storage_ptr__->m_backend).exp = iVar2;
      (__return_storage_ptr__->m_backend).neg = bVar5;
      (__return_storage_ptr__->m_backend).fpclass = fVar6;
      (__return_storage_ptr__->m_backend).prec_elem = iVar7;
    }
    lVar11 = lVar11 + 0x84;
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxScaler<R>::getRowMinAbsUnscaled(const SPxLPBase<R>& lp, int i) const
{
   assert(i < lp.nRows());
   assert(i >= 0);
   DataArray < int >& colscaleExp = *m_activeColscaleExp;
   DataArray < int >& rowscaleExp = *m_activeRowscaleExp;
   const SVectorBase<R>& rowVec = lp.LPRowSetBase<R>::rowVector(i);

   R min = R(infinity);

   int exp1;
   int exp2 = rowscaleExp[i];

   for(int j = 0; j < rowVec.size(); j++)
   {
      exp1 = colscaleExp[rowVec.index(j)];
      R abs = spxAbs(spxLdexp(rowVec.value(j), -exp1 - exp2));

      if(LT(abs, min, this->tolerances()->epsilon()))
         min = abs;
   }

   return min;
}